

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O3

string * __thiscall
t_rs_generator::rust_upper_case(string *__return_storage_ptr__,t_rs_generator *this,string *name)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  t_rs_generator *this_00;
  size_type sVar5;
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  pcVar2 = (name->_M_dataplus)._M_p;
  sVar3 = name->_M_string_length;
  if (sVar3 != 0) {
    sVar5 = 0;
    do {
      cVar1 = pcVar2[sVar5];
      iVar4 = isalpha((int)cVar1);
      if ((iVar4 != 0) && (iVar4 = islower((int)cVar1), iVar4 != 0)) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar2,pcVar2 + sVar3);
        t_generator::underscore(&local_50,&this->super_t_generator,&local_70);
        t_generator::uppercase(__return_storage_ptr__,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        local_90._0_8_ = (_Base_ptr)(local_90 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"__","");
        this_00 = (t_rs_generator *)local_b0;
        local_b0._0_8_ = local_b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"_","");
        string_replace(this_00,__return_storage_ptr__,(string *)local_90,(string *)local_b0);
        if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
          operator_delete((void *)local_b0._0_8_);
        }
        if ((_Base_ptr)local_90._0_8_ == (_Base_ptr)(local_90 + 0x10)) {
          return __return_storage_ptr__;
        }
        operator_delete((void *)local_90._0_8_);
        return __return_storage_ptr__;
      }
      sVar5 = sVar5 + 1;
    } while (sVar3 != sVar5);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_upper_case(const string& name) {
  bool all_uppercase = true;

  for (char i : name) {
    if (isalpha(i) && islower(i)) {
      all_uppercase = false;
      break;
    }
  }

  if (all_uppercase) {
    return name;
  } else {
    string str(uppercase(underscore(name)));
    string_replace(str, "__", "_");
    return str;
  }
}